

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOpenShell::~IfcOpenShell(IfcOpenShell *this)

{
  void *pvVar1;
  
  *(undefined8 *)
   &this[-1].super_IfcConnectedFaceSet.super_IfcTopologicalRepresentationItem.field_0x28 = 0x82a800;
  *(undefined8 *)
   &(this->super_IfcConnectedFaceSet).super_IfcTopologicalRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x82a878;
  *(undefined8 *)&this[-1].super_IfcConnectedFaceSet.field_0x38 = 0x82a828;
  *(undefined8 *)&this[-1].super_IfcConnectedFaceSet.field_0x48 = 0x82a850;
  pvVar1 = *(void **)&this[-1].super_IfcConnectedFaceSet.field_0x58;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this[-1].field_0x68 - (long)pvVar1);
  }
  operator_delete(&this[-1].super_IfcConnectedFaceSet.super_IfcTopologicalRepresentationItem.
                   field_0x28,0x70);
  return;
}

Assistant:

IfcOpenShell() : Object("IfcOpenShell") {}